

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O3

bool __thiscall
CNetBan::IsBanned(CNetBan *this,NETADDR_conflict *pAddr,char *pBuf,uint BufferSize,
                 int *pLastInfoQuery)

{
  long lVar1;
  bool bVar2;
  CBan<NETADDR> *pBan;
  long lVar3;
  byte bVar4;
  CBan<CNetRange> *pBan_00;
  long lVar5;
  long in_FS_OFFSET;
  CNetHash aHash [17];
  undefined8 local_d0;
  CNetHash local_c8;
  uint auStack_c0 [34];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = 0x10;
  if (pAddr->type == 1) {
    lVar5 = 4;
  }
  local_c8.m_Hash = 0;
  local_c8.m_HashIndex = 0;
  bVar4 = 0;
  lVar3 = 0;
  do {
    bVar4 = bVar4 + pAddr->ip[lVar3];
    auStack_c0[lVar3 * 2] = (uint)bVar4;
    lVar1 = lVar3 + 1;
    auStack_c0[lVar3 * 2 + 1] = (int)lVar5 - 1U & (uint)lVar1;
    lVar3 = lVar1;
  } while (lVar5 != lVar1);
  pBan = CBanPool<NETADDR,_1>::Find(&this->m_BanAddrPool,pAddr,&local_c8 + lVar5);
  if (pBan == (CBan<NETADDR> *)0x0) {
    local_d0 = &this->m_BanRangePool;
    lVar3 = lVar5;
    do {
      for (pBan_00 = local_d0->m_paaHashList[*(int *)((long)&local_d0 + lVar3 * 8 + 4)]
                     [*(int *)(&local_d0 + lVar3)]; pBan_00 != (CBan<CNetRange> *)0x0;
          pBan_00 = pBan_00->m_pHashNext) {
        bVar2 = NetMatch(this,&pBan_00->m_Data,pAddr,(int)(lVar3 + -1),(int)lVar5);
        if (bVar2) {
          MakeBanInfo<CNetRange>(this,pBan_00,pBuf,BufferSize,0,pLastInfoQuery);
          goto LAB_00137776;
        }
      }
      bVar2 = 1 < lVar3;
      lVar3 = lVar3 + -1;
    } while (bVar2);
    bVar2 = false;
  }
  else {
    MakeBanInfo<NETADDR>(this,pBan,pBuf,BufferSize,0,pLastInfoQuery);
LAB_00137776:
    bVar2 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetBan::IsBanned(const NETADDR *pAddr, char *pBuf, unsigned BufferSize, int *pLastInfoQuery)
{
	CNetHash aHash[17];
	int Length = CNetHash::MakeHashArray(pAddr, aHash);

	// check ban addresses
	CBanAddr *pBan = m_BanAddrPool.Find(pAddr, &aHash[Length]);
	if(pBan)
	{
		MakeBanInfo(pBan, pBuf, BufferSize, MSGTYPE_PLAYER, pLastInfoQuery);
		return true;
	}

	// check ban ranges
	for(int i = Length-1; i >= 0; --i)
	{
		for(CBanRange *pBan = m_BanRangePool.First(&aHash[i]); pBan; pBan = pBan->m_pHashNext)
		{
			if(NetMatch(&pBan->m_Data, pAddr, i, Length))
			{
				MakeBanInfo(pBan, pBuf, BufferSize, MSGTYPE_PLAYER, pLastInfoQuery);
				return true;
			}
		}
	}

	return false;
}